

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O2

int32 rw::d3d::getLevelSize(Raster *raster,int32 level)

{
  return *(int32 *)(*(long *)((long)&raster->platform + (long)nativeRasterOffset) + 0x10 +
                   (long)level * 0x18);
}

Assistant:

int32
getLevelSize(Raster *raster, int32 level)
{
	D3dRaster *ras = GETD3DRASTEREXT(raster);
#ifdef RW_D3D9
	IDirect3DTexture9 *tex = (IDirect3DTexture9*)ras->texture;
	D3DSURFACE_DESC desc;
	tex->GetLevelDesc(level, &desc);
	return calculateTextureSize(desc.Width, desc.Height, 1, desc.Format);
#else
	RasterLevels *levels = (RasterLevels*)ras->texture;
	return levels->levels[level].size;
#endif
}